

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O3

Image * __thiscall nv::FloatImage::createImageGammaCorrect(FloatImage *this,float gamma)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  AutoPtr<nv::Image> this_00;
  anon_union_4_2_12391d8d_for_Color32_0 *paVar4;
  uint uVar5;
  uint idx;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  float *pfVar10;
  float __y;
  AutoPtr<nv::Image> img;
  AutoPtr<nv::Image> local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  if ((this->m_componentNum != 4) &&
     (iVar3 = nvAbort("m_componentNum == 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                      ,0x76,"Image *nv::FloatImage::createImageGammaCorrect(float) const"),
     iVar3 == 1)) {
    raise(5);
  }
  this_00.m_ptr = (Image *)operator_new(0x18);
  Image::Image(this_00.m_ptr);
  local_48.m_ptr = this_00.m_ptr;
  Image::allocate(this_00.m_ptr,(uint)this->m_width,(uint)this->m_height);
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  uVar8 = (uint)uVar2 * (uint)uVar1;
  uVar9 = (ulong)uVar8;
  if (uVar8 != 0) {
    pfVar10 = this->m_mem;
    __y = 1.0 / gamma;
    idx = 0;
    do {
      local_34 = powf(*pfVar10,__y);
      local_38 = powf(pfVar10[(ulong)uVar2 * (ulong)uVar1],__y);
      local_3c = powf(pfVar10[uVar8 * 2],__y);
      local_40 = pfVar10[uVar8 * 3];
      paVar4 = &Image::pixel(local_48.m_ptr,idx)->field_0;
      iVar3 = (int)(local_40 * 255.0);
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      if (0xfe < iVar3) {
        iVar3 = 0xff;
      }
      uVar5 = (uint)(local_3c * 255.0);
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      if (0xfe < (int)uVar5) {
        uVar5 = 0xff;
      }
      iVar6 = (int)(local_38 * 255.0);
      if (iVar6 < 1) {
        iVar6 = 0;
      }
      if (0xfe < iVar6) {
        iVar6 = 0xff;
      }
      iVar7 = (int)(local_34 * 255.0);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      if (0xfe < iVar7) {
        iVar7 = 0xff;
      }
      *paVar4 = (anon_union_4_2_12391d8d_for_Color32_0)
                (iVar6 << 8 | uVar5 | iVar7 << 0x10 | iVar3 << 0x18);
      idx = idx + 1;
      pfVar10 = pfVar10 + 1;
      uVar9 = uVar9 - 1;
      this_00.m_ptr = local_48.m_ptr;
    } while (uVar9 != 0);
  }
  local_48.m_ptr = (Image *)0x0;
  AutoPtr<nv::Image>::~AutoPtr(&local_48);
  return this_00.m_ptr;
}

Assistant:

Image * FloatImage::createImageGammaCorrect(float gamma/*= 2.2f*/) const
{
	nvCheck(m_componentNum == 4);
	
	AutoPtr<Image> img(new Image());
	img->allocate(m_width, m_height);
	
	const float * rChannel = this->channel(0);
	const float * gChannel = this->channel(1);
	const float * bChannel = this->channel(2);
	const float * aChannel = this->channel(3);

	const uint size = m_width * m_height;
	for(uint i = 0; i < size; i++)
	{
		const uint8 r = nv::clamp(int(255.0f * pow(rChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 g = nv::clamp(int(255.0f * pow(gChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 b = nv::clamp(int(255.0f * pow(bChannel[i], 1.0f/gamma)), 0, 255);
		const uint8 a = nv::clamp(int(255.0f * aChannel[i]), 0, 255);

		img->pixel(i) = Color32(r, g, b, a);
	}
	
	return img.release();
}